

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrismExtend.cpp
# Opt level: O0

int pztopology::Pr<pztopology::Pr<pztopology::TPZPoint>_>::SideNodeLocId(int side,int node)

{
  int side_00;
  int iVar1;
  ostream *poVar2;
  void *this;
  int side_01;
  int in_ESI;
  int in_EDI;
  int fatherlevel;
  int fatherside;
  int ftns;
  int in_stack_ffffffffffffffe0;
  int local_4;
  
  side_00 = in_EDI / 3;
  side_01 = in_EDI % 3;
  if (side_00 == 0) {
    local_4 = Pr<pztopology::TPZPoint>::SideNodeLocId(0,side_01);
  }
  else if (side_00 == 1) {
    local_4 = Pr<pztopology::TPZPoint>::SideNodeLocId(1,side_01);
    local_4 = local_4 + 2;
  }
  else {
    iVar1 = Pr<pztopology::TPZPoint>::NSideNodes(in_stack_ffffffffffffffe0);
    if (in_ESI / iVar1 == 0) {
      local_4 = Pr<pztopology::TPZPoint>::SideNodeLocId(side_00,side_01);
    }
    else if (in_ESI / iVar1 == 1) {
      Pr<pztopology::TPZPoint>::NSideNodes(side_01);
      local_4 = Pr<pztopology::TPZPoint>::SideNodeLocId(side_00,side_01);
      local_4 = local_4 + 2;
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cerr,
                               "Pr<TFather>::SideNodeLocId inconsistent side or node ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_EDI);
      poVar2 = std::operator<<(poVar2,' ');
      this = (void *)std::ostream::operator<<(poVar2,in_ESI);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int Pr<TFather>::SideNodeLocId(int side, int node)
	{
		int ftns = side/TFather::NSides;
		int fatherside = side%TFather::NSides;
		if(ftns == 0) return TFather::SideNodeLocId(side,node);
		if(ftns == 1) return TFather::SideNodeLocId(side-TFather::NSides,node)+TFather::NCornerNodes;
		int fatherlevel = node/TFather::NSideNodes(fatherside);
		if(fatherlevel == 0) return TFather::SideNodeLocId(fatherside,node);
		if(fatherlevel == 1) return TFather::SideNodeLocId(fatherside,node-TFather::NSideNodes(fatherside))+TFather::NCornerNodes;//TFather::NSideNodes(fatherside);
		PZError << "Pr<TFather>::SideNodeLocId inconsistent side or node " << side
		<< ' ' << node << endl;
		return -1;
	}